

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * tmalloc_large(mstate m,size_t nb)

{
  malloc_tree_chunk *pmVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  tchunkptr pmVar5;
  tbinptr pmVar6;
  malloc_tree_chunk *pmVar7;
  size_t *psVar8;
  byte bVar9;
  bool bVar10;
  byte local_148;
  bindex_t local_130;
  byte local_128;
  tchunkptr F_2;
  tchunkptr *C;
  size_t K_2;
  tchunkptr T;
  uint K_1;
  uint X_1;
  bindex_t I_1;
  tbinptr *H_1;
  tchunkptr TP;
  mchunkptr F_1;
  mchunkptr B;
  bindex_t I;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  mchunkptr r;
  size_t trem_1;
  binmap_t leftbits;
  size_t trem;
  tchunkptr rt;
  tchunkptr rst;
  size_t sizebits;
  uint K;
  uint X;
  bindex_t idx;
  tchunkptr t;
  size_t rsize;
  tchunkptr v;
  size_t nb_local;
  mstate m_local;
  
  rsize = 0;
  t = (tchunkptr)((nb ^ 0xffffffffffffffff) + 1);
  uVar4 = (uint)(nb >> 8);
  if (uVar4 == 0) {
    _K = 0;
  }
  else if (uVar4 < 0x10000) {
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    _K = (ulong)(uint)(iVar2 << 1) + (nb >> ((char)iVar2 + 7U & 0x3f) & 1);
  }
  else {
    _K = 0x1f;
  }
  idx = (bindex_t)m->treebins[_K];
  if ((tbinptr)idx != (tbinptr)0x0) {
    if (_K == 0x1f) {
      local_128 = 0;
    }
    else {
      local_128 = 0x3f - ((char)(_K >> 1) + '\x06');
    }
    rst = (tchunkptr)(nb << (local_128 & 0x3f));
    rt = (tchunkptr)0x0;
    while( true ) {
      pmVar5 = (tchunkptr)((*(ulong *)(idx + 8) & 0xfffffffffffffffc) - nb);
      if ((pmVar5 < t) && (rsize = idx, t = pmVar5, pmVar5 == (tchunkptr)0x0)) goto LAB_00134fad;
      pmVar5 = *(tchunkptr *)(idx + 0x28);
      idx = *(long *)(idx + 0x20 + ((long)rst >> 0x3f) * -8);
      if ((pmVar5 != (tchunkptr)0x0) && (pmVar5 != (tchunkptr)idx)) {
        rt = pmVar5;
      }
      if ((tchunkptr)idx == (tchunkptr)0x0) break;
      rst = (tchunkptr)((long)rst << 1);
    }
    idx = (bindex_t)rt;
  }
LAB_00134fad:
  if (((idx == 0) && (rsize == 0)) &&
     (uVar4 = ((1 << ((byte)_K & 0x1f)) << 1 | ((1 << ((byte)_K & 0x1f)) << 1 ^ 0xffffffffU) + 1) &
              m->treemap, uVar4 != 0)) {
    uVar3 = 0;
    for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
      uVar3 = uVar3 + 1;
    }
    idx = (bindex_t)m->treebins[uVar3];
  }
  while (idx != 0) {
    pmVar5 = (tchunkptr)((*(ulong *)(idx + 8) & 0xfffffffffffffffc) - nb);
    if (pmVar5 < t) {
      rsize = idx;
      t = pmVar5;
    }
    if (*(long *)(idx + 0x20) == 0) {
      local_130 = *(bindex_t *)(idx + 0x28);
    }
    else {
      local_130 = *(bindex_t *)(idx + 0x20);
    }
    idx = local_130;
  }
  if ((rsize == 0) || ((tchunkptr)(m->dvsize - nb) <= t)) {
    return (void *)0x0;
  }
  pmVar6 = (tbinptr)(rsize + nb);
  pmVar7 = *(malloc_tree_chunk **)(rsize + 0x30);
  if (*(size_t *)(rsize + 0x18) == rsize) {
    CP = (tchunkptr *)(rsize + 0x28);
    F = *(tchunkptr *)(rsize + 0x28);
    if (F == (tchunkptr)0x0) {
      CP = (tchunkptr *)(rsize + 0x20);
      F = *(tchunkptr *)(rsize + 0x20);
      if (F == (tchunkptr)0x0) goto LAB_001351dd;
    }
    while( true ) {
      H = F->child + 1;
      bVar10 = true;
      if (F->child[1] == (malloc_tree_chunk *)0x0) {
        H = F->child;
        bVar10 = F->child[0] != (malloc_tree_chunk *)0x0;
      }
      if (!bVar10) break;
      CP = H;
      F = *H;
    }
    *CP = (tchunkptr)0x0;
  }
  else {
    pmVar1 = *(malloc_tree_chunk **)(rsize + 0x10);
    F = *(tchunkptr *)(rsize + 0x18);
    pmVar1->bk = F;
    F->fd = pmVar1;
  }
LAB_001351dd:
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    if ((tbinptr)rsize == m->treebins[*(long *)(rsize + 0x38)]) {
      m->treebins[*(long *)(rsize + 0x38)] = F;
      if (F == (tchunkptr)0x0) {
        m->treemap = (1 << ((byte)*(undefined8 *)(rsize + 0x38) & 0x1f) ^ 0xffffffffU) & m->treemap;
      }
    }
    else if (pmVar7->child[0] == (malloc_tree_chunk *)rsize) {
      pmVar7->child[0] = F;
    }
    else {
      pmVar7->child[1] = F;
    }
    if (F != (tchunkptr)0x0) {
      F->parent = pmVar7;
      pmVar7 = *(malloc_tree_chunk **)(rsize + 0x20);
      if (pmVar7 != (malloc_tree_chunk *)0x0) {
        F->child[0] = pmVar7;
        pmVar7->parent = F;
      }
      pmVar7 = *(malloc_tree_chunk **)(rsize + 0x28);
      if (pmVar7 != (malloc_tree_chunk *)0x0) {
        F->child[1] = pmVar7;
        pmVar7->parent = F;
      }
    }
  }
  if (t < (tchunkptr)0x20) {
    *(size_t *)(rsize + 8) = (long)t->child + (nb - 0x20) | 3;
    *(ulong *)((long)t->child + rsize + nb + -0x18) =
         *(ulong *)((long)t->child + rsize + nb + -0x18) | 1;
  }
  else {
    *(size_t *)(rsize + 8) = nb | 3;
    pmVar6->head = (ulong)t | 1;
    *(tchunkptr *)((long)t->child + (long)(pmVar6->child + -8)) = t;
    if ((ulong)t >> 3 < 0x20) {
      pmVar7 = (malloc_tree_chunk *)(m->smallbins + ((ulong)t >> 3) * 2);
      bVar9 = (byte)((ulong)t >> 3);
      if ((m->smallmap & 1 << (bVar9 & 0x1f)) == 0) {
        m->smallmap = 1 << (bVar9 & 0x1f) | m->smallmap;
        TP = pmVar7;
      }
      else {
        TP = pmVar7->fd;
      }
      pmVar7->fd = pmVar6;
      TP->bk = pmVar6;
      pmVar6->fd = TP;
      pmVar6->bk = pmVar7;
    }
    else {
      uVar4 = (uint)((ulong)t >> 8);
      if (uVar4 == 0) {
        _K_1 = 0;
      }
      else if (uVar4 < 0x10000) {
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        _K_1 = (ulong)(uint)(iVar2 << 1) + ((ulong)t >> ((char)iVar2 + 7U & 0x3f) & 1);
      }
      else {
        _K_1 = 0x1f;
      }
      pmVar7 = (malloc_tree_chunk *)(m->treebins + _K_1);
      pmVar6->index = _K_1;
      pmVar6->child[1] = (malloc_tree_chunk *)0x0;
      pmVar6->child[0] = (malloc_tree_chunk *)0x0;
      if ((m->treemap & 1 << ((byte)_K_1 & 0x1f)) == 0) {
        m->treemap = 1 << ((byte)_K_1 & 0x1f) | m->treemap;
        pmVar7->prev_foot = (size_t)pmVar6;
        pmVar6->parent = pmVar7;
        pmVar6->bk = pmVar6;
        pmVar6->fd = pmVar6;
      }
      else {
        K_2 = pmVar7->prev_foot;
        if (_K_1 == 0x1f) {
          local_148 = 0;
        }
        else {
          local_148 = 0x3f - ((char)(_K_1 >> 1) + '\x06');
        }
        C = (tchunkptr *)((long)t << (local_148 & 0x3f));
        while ((tchunkptr)(*(ulong *)(K_2 + 8) & 0xfffffffffffffffc) != t) {
          psVar8 = (size_t *)(K_2 + 0x20 + ((long)C >> 0x3f) * -8);
          C = (tchunkptr *)((long)C << 1);
          if (*psVar8 == 0) {
            *psVar8 = (size_t)pmVar6;
            pmVar6->parent = (malloc_tree_chunk *)K_2;
            pmVar6->bk = pmVar6;
            pmVar6->fd = pmVar6;
            goto LAB_0013574a;
          }
          K_2 = *psVar8;
        }
        pmVar7 = *(malloc_tree_chunk **)(K_2 + 0x10);
        pmVar7->bk = pmVar6;
        *(tbinptr *)(K_2 + 0x10) = pmVar6;
        pmVar6->fd = pmVar7;
        pmVar6->bk = (malloc_tree_chunk *)K_2;
        pmVar6->parent = (malloc_tree_chunk *)0x0;
      }
    }
  }
LAB_0013574a:
  return (void *)(rsize + 0x10);
}

Assistant:

static void *tmalloc_large(mstate m, size_t nb)
{
  tchunkptr v = 0;
  size_t rsize = ~nb+1; /* Unsigned negation */
  tchunkptr t;
  bindex_t idx;
  compute_tree_index(nb, idx);

  if ((t = *treebin_at(m, idx)) != 0) {
    /* Traverse tree for this bin looking for node with size == nb */
    size_t sizebits = nb << leftshift_for_tree_index(idx);
    tchunkptr rst = 0;  /* The deepest untaken right subtree */
    for (;;) {
      tchunkptr rt;
      size_t trem = chunksize(t) - nb;
      if (trem < rsize) {
	v = t;
	if ((rsize = trem) == 0)
	  break;
      }
      rt = t->child[1];
      t = t->child[(sizebits >> (SIZE_T_BITSIZE-SIZE_T_ONE)) & 1];
      if (rt != 0 && rt != t)
	rst = rt;
      if (t == 0) {
	t = rst; /* set t to least subtree holding sizes > nb */
	break;
      }
      sizebits <<= 1;
    }
  }

  if (t == 0 && v == 0) { /* set t to root of next non-empty treebin */
    binmap_t leftbits = left_bits(idx2bit(idx)) & m->treemap;
    if (leftbits != 0)
      t = *treebin_at(m, lj_ffs(leftbits));
  }

  while (t != 0) { /* find smallest of tree or subtree */
    size_t trem = chunksize(t) - nb;
    if (trem < rsize) {
      rsize = trem;
      v = t;
    }
    t = leftmost_child(t);
  }

  /*  If dv is a better fit, return NULL so malloc will use it */
  if (v != 0 && rsize < (size_t)(m->dvsize - nb)) {
    mchunkptr r = chunk_plus_offset(v, nb);
    unlink_large_chunk(m, v);
    if (rsize < MIN_CHUNK_SIZE) {
      set_inuse_and_pinuse(m, v, (rsize + nb));
    } else {
      set_size_and_pinuse_of_inuse_chunk(m, v, nb);
      set_size_and_pinuse_of_free_chunk(r, rsize);
      insert_chunk(m, r, rsize);
    }
    return chunk2mem(v);
  }
  return NULL;
}